

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_unres_glob_erase(lys_glob_unres *unres)

{
  uint local_14;
  uint32_t i;
  lys_glob_unres *unres_local;
  
  for (local_14 = 0; local_14 < (unres->dep_sets).count; local_14 = local_14 + 1) {
    ly_set_free((ly_set *)(unres->dep_sets).field_2.dnodes[local_14],(_func_void_void_ptr *)0x0);
  }
  ly_set_erase(&unres->dep_sets,(_func_void_void_ptr *)0x0);
  ly_set_erase(&unres->implementing,(_func_void_void_ptr *)0x0);
  ly_set_erase(&unres->creating,(_func_void_void_ptr *)0x0);
  if ((unres->ds_unres).whens.count != 0) {
    __assert_fail("!unres->ds_unres.whens.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x490,"void lys_unres_glob_erase(struct lys_glob_unres *)");
  }
  if ((unres->ds_unres).musts.count != 0) {
    __assert_fail("!unres->ds_unres.musts.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x491,"void lys_unres_glob_erase(struct lys_glob_unres *)");
  }
  if ((unres->ds_unres).leafrefs.count == 0) {
    if ((unres->ds_unres).disabled_leafrefs.count != 0) {
      __assert_fail("!unres->ds_unres.disabled_leafrefs.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                    ,0x493,"void lys_unres_glob_erase(struct lys_glob_unres *)");
    }
    if ((unres->ds_unres).dflts.count == 0) {
      if ((unres->ds_unres).disabled.count == 0) {
        return;
      }
      __assert_fail("!unres->ds_unres.disabled.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                    ,0x495,"void lys_unres_glob_erase(struct lys_glob_unres *)");
    }
    __assert_fail("!unres->ds_unres.dflts.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                  ,0x494,"void lys_unres_glob_erase(struct lys_glob_unres *)");
  }
  __assert_fail("!unres->ds_unres.leafrefs.count",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema.c"
                ,0x492,"void lys_unres_glob_erase(struct lys_glob_unres *)");
}

Assistant:

void
lys_unres_glob_erase(struct lys_glob_unres *unres)
{
    uint32_t i;

    for (i = 0; i < unres->dep_sets.count; ++i) {
        ly_set_free(unres->dep_sets.objs[i], NULL);
    }
    ly_set_erase(&unres->dep_sets, NULL);
    ly_set_erase(&unres->implementing, NULL);
    ly_set_erase(&unres->creating, NULL);

    assert(!unres->ds_unres.whens.count);
    assert(!unres->ds_unres.musts.count);
    assert(!unres->ds_unres.leafrefs.count);
    assert(!unres->ds_unres.disabled_leafrefs.count);
    assert(!unres->ds_unres.dflts.count);
    assert(!unres->ds_unres.disabled.count);
}